

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_brdf.h
# Opt level: O3

vec2 __thiscall djb::tab_r::cdfv(tab_r *this,vec2 *u,float_t zi)

{
  int iVar1;
  float_t u_00;
  float_t u_01;
  pointer pvVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  float fVar6;
  float fVar8;
  vec2 vVar7;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float_t w3;
  float_t w2;
  float_t w1;
  int i2;
  int k2;
  int k1;
  int j2;
  int j1;
  int i1;
  float local_54;
  float local_50;
  float local_4c;
  int local_48;
  int local_44;
  int local_40;
  int local_3c;
  int local_38;
  int local_34;
  
  u_00 = u->x;
  u_01 = u->y;
  fVar6 = acosf(zi);
  pvVar2 = (this->m_cdf).super__Vector_base<djb::vec2,_std::allocator<djb::vec2>_>._M_impl.
           super__Vector_impl_data._M_start;
  spline::uwrap_edge(u_00,0x40,&local_34,&local_48,&local_4c);
  spline::uwrap_edge(u_01,0x100,&local_38,&local_3c,&local_50);
  spline::uwrap_edge(fVar6 * 0.63661975 * fVar6 * 0.63661975,0x10,&local_40,&local_44,&local_54);
  iVar1 = local_40 * 0x4000 + local_38 * 0x40;
  iVar5 = local_40 * 0x4000 + local_3c * 0x40;
  iVar3 = local_38 * 0x40 + local_44 * 0x4000;
  iVar4 = local_44 * 0x4000 + local_3c * 0x40;
  fVar6 = pvVar2[iVar1 + local_34].x;
  fVar8 = pvVar2[iVar1 + local_34].y;
  fVar6 = (pvVar2[iVar1 + local_48].x - fVar6) * local_4c + fVar6;
  fVar8 = (pvVar2[iVar1 + local_48].y - fVar8) * local_4c + fVar8;
  fVar9 = pvVar2[iVar5 + local_34].x;
  fVar11 = pvVar2[iVar5 + local_34].y;
  fVar10 = pvVar2[iVar3 + local_34].x;
  fVar12 = pvVar2[iVar3 + local_34].y;
  fVar10 = (pvVar2[iVar3 + local_48].x - fVar10) * local_4c + fVar10;
  fVar12 = (pvVar2[iVar3 + local_48].y - fVar12) * local_4c + fVar12;
  fVar13 = pvVar2[local_34 + iVar4].x;
  fVar14 = pvVar2[local_34 + iVar4].y;
  fVar6 = (((pvVar2[iVar5 + local_48].x - fVar9) * local_4c + fVar9) - fVar6) * local_50 + fVar6;
  fVar8 = (((pvVar2[iVar5 + local_48].y - fVar11) * local_4c + fVar11) - fVar8) * local_50 + fVar8;
  vVar7.x = local_54 *
            (((((pvVar2[iVar4 + local_48].x - fVar13) * local_4c + fVar13) - fVar10) * local_50 +
             fVar10) - fVar6) + fVar6;
  vVar7.y = local_54 *
            (((((pvVar2[iVar4 + local_48].y - fVar14) * local_4c + fVar14) - fVar12) * local_50 +
             fVar12) - fVar8) + fVar8;
  return vVar7;
}

Assistant:

vec2 tab_r::cdfv(const vec2 &u, float_t zi) const
{
	int res1 = 64;
	int res2 = 256;
	int res3 = 16;
	float_t u1 = u.x;
	float_t u2 = u.y;
	float_t u3 = sqr(acos(zi) * (2 / m_pi()));

	return spline::eval3d(m_cdf, res1, res2, res3,
	                      spline::uwrap_edge, u1,
	                      spline::uwrap_edge, u2,
	                      spline::uwrap_edge, u3);
}